

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O0

void avg_cdf_symbol(aom_cdf_prob *cdf_ptr_left,aom_cdf_prob *cdf_ptr_tr,int num_cdfs,int cdf_stride,
                   int nsymbs,int wt_left,int wt_tr)

{
  int j;
  int i;
  int wt_left_local;
  int nsymbs_local;
  int cdf_stride_local;
  int num_cdfs_local;
  aom_cdf_prob *cdf_ptr_tr_local;
  aom_cdf_prob *cdf_ptr_left_local;
  
  for (i = 0; i < num_cdfs; i = i + 1) {
    for (j = 0; j <= nsymbs; j = j + 1) {
      cdf_ptr_left[i * cdf_stride + j] =
           (aom_cdf_prob)
           ((int)((uint)cdf_ptr_left[i * cdf_stride + j] * wt_left +
                  (uint)cdf_ptr_tr[i * cdf_stride + j] * wt_tr + (wt_left + wt_tr) / 2) /
           (wt_left + wt_tr));
    }
  }
  return;
}

Assistant:

static void avg_cdf_symbol(aom_cdf_prob *cdf_ptr_left, aom_cdf_prob *cdf_ptr_tr,
                           int num_cdfs, int cdf_stride, int nsymbs,
                           int wt_left, int wt_tr) {
  for (int i = 0; i < num_cdfs; i++) {
    for (int j = 0; j <= nsymbs; j++) {
      cdf_ptr_left[i * cdf_stride + j] =
          (aom_cdf_prob)(((int)cdf_ptr_left[i * cdf_stride + j] * wt_left +
                          (int)cdf_ptr_tr[i * cdf_stride + j] * wt_tr +
                          ((wt_left + wt_tr) / 2)) /
                         (wt_left + wt_tr));
      assert(cdf_ptr_left[i * cdf_stride + j] >= 0 &&
             cdf_ptr_left[i * cdf_stride + j] < CDF_PROB_TOP);
    }
  }
}